

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day06a.cpp
# Opt level: O1

string * day6a::recover_message(string *__return_storage_ptr__,string *input)

{
  pair<char,_char> *ppVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  undefined2 uVar5;
  pair<char,_char> *ppVar6;
  string *psVar7;
  char *pcVar8;
  istream *piVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  char cVar15;
  char cVar16;
  size_type sVar17;
  pair<char,_char> *ppVar18;
  char *pcVar19;
  long lVar20;
  array<std::pair<char,_char>,_26UL> *letters;
  pair<char,_char> *ppVar21;
  string line;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  columns;
  istringstream stream;
  allocator_type local_1f1;
  undefined1 *local_1f0;
  size_type local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  string *local_1d0;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  local_1c8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_1f0 = &local_1e0;
  local_1e8 = 0;
  local_1e0 = 0;
  std::operator>>((istream *)local_1b0,(string *)&local_1f0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)local_1e8);
  std::
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  ::vector(&local_1c8,local_1e8,&local_1f1);
  do {
    if (local_1e8 != 0) {
      lVar13 = (long)local_1c8.
                     super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -0xc2;
      sVar17 = 0;
      do {
        cVar15 = local_1f0[sVar17];
        *(char *)(lVar13 + (long)cVar15 * 2) = cVar15;
        pcVar14 = (char *)(lVar13 + (long)cVar15 * 2 + 1);
        *pcVar14 = *pcVar14 + '\x01';
        sVar17 = sVar17 + 1;
        lVar13 = lVar13 + 0x34;
      } while (local_1e8 != sVar17);
    }
    piVar9 = std::operator>>((istream *)local_1b0,(string *)&local_1f0);
  } while (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0);
  local_1d0 = __return_storage_ptr__;
  if (local_1c8.
      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar14 = &((pair<char,_char> *)
               ((long)local_1c8.
                      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0x20))->second;
    lVar13 = 0;
    ppVar21 = (local_1c8.
               super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
    do {
      ppVar1 = ppVar21 + 0x1a;
      std::
      __introsort_loop<std::pair<char,char>*,long,__gnu_cxx::__ops::_Iter_comp_iter<day6a::recover_message(std::__cxx11::string_const&)::__0>>
                (ppVar21,ppVar1,8);
      lVar10 = 2;
      lVar11 = 2;
      ppVar18 = ppVar21;
      do {
        cVar15 = ppVar18[1].first;
        cVar16 = ppVar18[1].second;
        if (ppVar21->second < ppVar18[1].second) {
          lVar20 = 0;
          do {
            ppVar18[lVar20 + 1] = ppVar18[lVar20];
            lVar2 = lVar10 + lVar20;
            lVar20 = lVar20 + -1;
          } while (1 < lVar2 + -1);
          ppVar21->first = cVar15;
          ppVar21->second = cVar16;
        }
        else {
          ppVar6 = ppVar18 + 1;
          cVar4 = ppVar18->second;
          while (cVar4 < cVar16) {
            cVar3 = *(char *)((long)(ppVar6 + -2) + 1);
            ppVar6->first = ((array<std::pair<char,_char>,_26UL> *)(ppVar6 + -1))->_M_elems[0].first
            ;
            ppVar6->second = cVar4;
            ppVar6 = ppVar6 + -1;
            cVar4 = cVar3;
          }
          ppVar6->first = cVar15;
          ppVar6->second = cVar16;
        }
        lVar11 = lVar11 + 2;
        lVar10 = lVar10 + 1;
        ppVar18 = ppVar18 + 1;
      } while (lVar11 != 0x20);
      lVar10 = 0x20;
      pcVar12 = pcVar14;
      do {
        uVar5 = *(undefined2 *)(&ppVar21->first + lVar10);
        cVar15 = *(char *)((long)ppVar21 + lVar10 + -1);
        cVar16 = (char)((ushort)uVar5 >> 8);
        pcVar8 = pcVar12;
        if (cVar15 < cVar16) {
          do {
            pcVar19 = pcVar8;
            cVar4 = pcVar19[-4];
            ((pair<char,_char> *)(pcVar19 + -1))->first = pcVar19[-3];
            *pcVar19 = cVar15;
            pcVar8 = pcVar19 + -2;
            cVar15 = cVar4;
          } while (cVar4 < cVar16);
          pcVar19 = pcVar19 + -3;
        }
        else {
          pcVar19 = &ppVar21->first + lVar10;
        }
        *pcVar19 = (char)uVar5;
        pcVar19[1] = cVar16;
        lVar10 = lVar10 + 2;
        pcVar12 = pcVar12 + 2;
      } while (lVar10 != 0x34);
      (local_1d0->_M_dataplus)._M_p[lVar13] = ppVar21->first;
      lVar13 = lVar13 + 1;
      pcVar14 = pcVar14 + 0x34;
      ppVar21 = ppVar1;
    } while (ppVar1 != (local_1c8.
                        super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_elems);
  }
  if (local_1c8.
      super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  psVar7 = local_1d0;
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return psVar7;
}

Assistant:

std::string recover_message(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		stream >> line;
		std::string ret(line.size(), ' ');
		std::vector<std::array<std::pair<char, char>, 26>> columns(line.size());
		do {
			int i = 0;
			for(auto c : line) {
				auto& l = columns[i++][c - 'a'];
				l.first = c;
				l.second++;
			}
		} while(stream >> line);

		int i = 0;
		for(auto& letters : columns) {
			std::sort(letters.begin(), letters.end(), [](const auto& a, const auto& b) {
				return a.second > b.second;
			});
			ret[i++] = letters[0].first;
		}
		return ret;
	}